

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeBase * AnalyzeType(ExpressionContext *ctx,SynBase *syntax,bool onlyType,bool *failed)

{
  SynCallArgument *pSVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ScopeData *target;
  IntrusiveList<TypeHandle> generics;
  IntrusiveList<TypeHandle> arguments_00;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  SynTypeAlias *pSVar10;
  SynTypeReference *pSVar11;
  TypeBase *pTVar12;
  SynTypeArray *pSVar13;
  SynArrayIndex *source;
  TypeUnsizedArray *pTVar14;
  ExprBase *pEVar15;
  ExprIntegerLiteral *pEVar16;
  TypeArgumentSet *pTVar17;
  TypeHandle *pTVar18;
  TypeClass *pTVar19;
  TypeArray *pTVar20;
  SynTypeFunction *pSVar21;
  SynTypeof *pSVar22;
  SynTypeSimple *pSVar23;
  SynMemberAccess *pSVar24;
  ExprTypeLiteral *pEVar25;
  SynTypeGenericInstance *pSVar26;
  TypeGenericClass *pTVar27;
  uint local_2cc;
  TypeBase *type_5;
  SynBase *el_1;
  IntrusiveList<TypeHandle> types;
  undefined1 auStack_250 [7];
  bool isGeneric;
  IntrusiveList<SynIdentifier> aliases;
  TypeGenericClassProto *proto;
  TypeBase *baseType;
  SynTypeGenericInstance *node_8;
  ExprTypeLiteral *typeLiteral;
  ExprBase *result;
  TypeBase *value_1;
  SynMemberAccess *node_7;
  TypeBase *type_4;
  SynIdentifier *part;
  ScopeData *pSStack_1f0;
  uint hash;
  ScopeData *nsScope;
  SynTypeSimple *node_6;
  ExprBase *value;
  TypeBase *type_3;
  uint traceDepth;
  ScopeData *scope;
  uint errorBufSize;
  char *errorBuf;
  undefined1 local_1a8 [7];
  bool prevErrorHandlerNested;
  jmp_buf prevErrorHandler;
  SynTypeof *node_5;
  TypeBase *argType;
  SynBase *el;
  IntrusiveList<TypeHandle> arguments;
  TypeBase *returnType;
  SynTypeFunction *node_4;
  TypeClass *typeClass;
  TypeArgumentSet *lhs;
  ExprIntegerLiteral *number;
  ExprBase *size;
  SynCallArgument *argument;
  TypeBase *type_2;
  SynArrayIndex *node_3;
  TypeBase *type_1;
  SynTypeArray *node_2;
  TypeBase *type;
  SynTypeReference *node_1;
  SynTypeAlias *node;
  bool *failed_local;
  bool onlyType_local;
  SynBase *syntax_local;
  ExpressionContext *ctx_local;
  
  bVar6 = isType<SynTypeAuto>(syntax);
  if (bVar6) {
    ctx_local = (ExpressionContext *)ctx->typeAuto;
  }
  else {
    bVar6 = isType<SynTypeGeneric>(syntax);
    if (bVar6) {
      ctx_local = (ExpressionContext *)ctx->typeGeneric;
    }
    else {
      pSVar10 = getType<SynTypeAlias>(syntax);
      if (pSVar10 == (SynTypeAlias *)0x0) {
        pSVar11 = getType<SynTypeReference>(syntax);
        if (pSVar11 == (SynTypeReference *)0x0) {
          pSVar13 = getType<SynTypeArray>(syntax);
          if (pSVar13 == (SynTypeArray *)0x0) {
            source = getType<SynArrayIndex>(syntax);
            if (source != (SynArrayIndex *)0x0) {
              pTVar12 = AnalyzeType(ctx,source->value,onlyType,failed);
              if ((!onlyType) && (pTVar12 == (TypeBase *)0x0)) {
                return (TypeBase *)0x0;
              }
              bVar6 = isType<TypeVoid>(pTVar12);
              if (bVar6) {
                anon_unknown.dwarf_e7629::Report
                          (ctx,syntax,"ERROR: cannot define an array of \'void\'");
                pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                return pTVar12;
              }
              bVar6 = isType<TypeAuto>(pTVar12);
              if (bVar6) {
                bVar6 = IntrusiveList<SynCallArgument>::empty(&source->arguments);
                if (!bVar6) {
                  anon_unknown.dwarf_e7629::Stop
                            (ctx,syntax,"ERROR: cannot specify array size for auto");
                }
                return &ctx->typeAutoArray->super_TypeBase;
              }
              bVar6 = isType<TypeError>(pTVar12);
              if (bVar6) {
                pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                return pTVar12;
              }
              bVar6 = IntrusiveList<SynCallArgument>::empty(&source->arguments);
              if (bVar6) {
                if (0xffff < pTVar12->size) {
                  anon_unknown.dwarf_e7629::Stop
                            (ctx,syntax,"ERROR: array element size cannot exceed 65535 bytes");
                }
                bVar6 = AssertResolvableType(ctx,syntax,pTVar12,true);
                if (!bVar6) {
                  pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                  return pTVar12;
                }
                pTVar14 = ExpressionContext::GetUnsizedArrayType(ctx,pTVar12);
                return (TypeBase *)pTVar14;
              }
              uVar7 = IntrusiveList<SynCallArgument>::size(&source->arguments);
              if (1 < uVar7) {
                anon_unknown.dwarf_e7629::Stop
                          (ctx,syntax,"ERROR: \',\' is not expected in array type size");
              }
              pSVar1 = (source->arguments).head;
              if (pSVar1->name != (SynIdentifier *)0x0) {
                anon_unknown.dwarf_e7629::Stop
                          (ctx,syntax,"ERROR: named argument not expected in array type size");
              }
              pEVar15 = AnalyzeExpression(ctx,pSVar1->value);
              bVar6 = isType<TypeError>(pEVar15->type);
              if (bVar6) {
                pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                return pTVar12;
              }
              pEVar15 = CreateCast(ctx,&source->super_SynBase,pEVar15,ctx->typeLong,false);
              pEVar15 = anon_unknown.dwarf_e7629::EvaluateExpression(ctx,syntax,pEVar15);
              pEVar16 = getType<ExprIntegerLiteral>(pEVar15);
              if (pEVar16 != (ExprIntegerLiteral *)0x0) {
                pTVar17 = getType<TypeArgumentSet>(pTVar12);
                if (pTVar17 != (TypeArgumentSet *)0x0) {
                  if (pEVar16->value < 0) {
                    anon_unknown.dwarf_e7629::Stop
                              (ctx,syntax,"ERROR: argument index can\'t be negative");
                  }
                  bVar6 = IntrusiveList<TypeHandle>::empty(&pTVar17->types);
                  if (bVar6) {
                    anon_unknown.dwarf_e7629::Stop
                              (ctx,syntax,"ERROR: function argument set is empty");
                  }
                  lVar2 = pEVar16->value;
                  uVar7 = IntrusiveList<TypeHandle>::size(&pTVar17->types);
                  if ((long)(ulong)uVar7 <= lVar2) {
                    pcVar3 = (pTVar12->name).end;
                    pcVar4 = (pTVar12->name).begin;
                    pcVar5 = (pTVar12->name).begin;
                    uVar7 = IntrusiveList<TypeHandle>::size(&pTVar17->types);
                    anon_unknown.dwarf_e7629::Stop
                              (ctx,syntax,
                               "ERROR: this function type \'%.*s\' has only %d argument(s)",
                               (ulong)(uint)((int)pcVar3 - (int)pcVar4),pcVar5,(ulong)uVar7);
                  }
                  pTVar18 = IntrusiveList<TypeHandle>::operator[]
                                      (&pTVar17->types,(uint)pEVar16->value);
                  return pTVar18->type;
                }
                if (pEVar16->value < 1) {
                  anon_unknown.dwarf_e7629::Stop
                            (ctx,syntax,"ERROR: array size can\'t be negative or zero");
                }
                pTVar19 = getType<TypeClass>(pTVar12);
                if ((pTVar19 != (TypeClass *)0x0) && ((pTVar19->hasFinalizer & 1U) != 0)) {
                  anon_unknown.dwarf_e7629::Stop
                            (ctx,syntax,
                             "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
                             ,(ulong)(uint)((int)(pTVar12->name).end - (int)(pTVar12->name).begin),
                             (pTVar12->name).begin);
                }
                if (0xffff < pTVar12->size) {
                  anon_unknown.dwarf_e7629::Stop
                            (ctx,syntax,"ERROR: array element size cannot exceed 65535 bytes");
                }
                bVar6 = AssertResolvableType(ctx,syntax,pTVar12,true);
                if (!bVar6) {
                  pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                  return pTVar12;
                }
                pTVar20 = ExpressionContext::GetArrayType(ctx,pTVar12,pEVar16->value);
                return &pTVar20->super_TypeBase;
              }
              if (!onlyType) {
                return (TypeBase *)0x0;
              }
              anon_unknown.dwarf_e7629::Stop
                        (ctx,syntax,"ERROR: index must be a constant expression");
            }
            pSVar21 = getType<SynTypeFunction>(syntax);
            if (pSVar21 == (SynTypeFunction *)0x0) {
              pSVar22 = getType<SynTypeof>(syntax);
              if (pSVar22 != (SynTypeof *)0x0) {
                memcpy(local_1a8,ctx->errorHandler,200);
                bVar6 = (bool)(ctx->errorHandlerNested & 1);
                ctx->errorHandlerNested = true;
                pcVar3 = ctx->errorBuf;
                uVar7 = ctx->errorBufSize;
                if (failed != (bool *)0x0) {
                  ctx->errorBuf = (char *)0x0;
                  ctx->errorBufSize = 0;
                }
                target = ctx->scope;
                uVar8 = NULLC::TraceGetDepth();
                iVar9 = _setjmp((__jmp_buf_tag *)ctx->errorHandler);
                if (iVar9 != 0) {
                  NULLC::TraceLeaveTo(uVar8);
                  if (ctx->scope != target) {
                    ExpressionContext::SwitchToScopeAtPoint(ctx,target,(SynBase *)0x0);
                  }
                  memcpy(ctx->errorHandler,local_1a8,200);
                  ctx->errorHandlerNested = bVar6;
                  ctx->errorBuf = pcVar3;
                  ctx->errorBufSize = uVar7;
                  if (failed != (bool *)0x0) {
                    *failed = true;
                    return ctx->typeGeneric;
                  }
                  longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
                }
                value = (ExprBase *)AnalyzeType(ctx,pSVar22->value,false,(bool *)0x0);
                if ((TypeBase *)value == (TypeBase *)0x0) {
                  pEVar15 = AnalyzeExpression(ctx,pSVar22->value);
                  if (pEVar15->type == ctx->typeAuto) {
                    anon_unknown.dwarf_e7629::Stop
                              (ctx,syntax,"ERROR: cannot take typeid from auto type");
                  }
                  AssertValueExpression(ctx,syntax,pEVar15);
                  value = (ExprBase *)pEVar15->type;
                }
                memcpy(ctx->errorHandler,local_1a8,200);
                ctx->errorHandlerNested = bVar6;
                ctx->errorBuf = pcVar3;
                ctx->errorBufSize = uVar7;
                if (value != (ExprBase *)0x0) {
                  bVar6 = AssertResolvableType(ctx,pSVar22->value,(TypeBase *)value,false);
                  if (!bVar6) {
                    pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                    return pTVar12;
                  }
                  return (TypeBase *)value;
                }
              }
              pSVar23 = getType<SynTypeSimple>(syntax);
              if (pSVar23 == (SynTypeSimple *)0x0) {
                pSVar24 = getType<SynMemberAccess>(syntax);
                if (pSVar24 == (SynMemberAccess *)0x0) {
                  pSVar26 = getType<SynTypeGenericInstance>(syntax);
                  if (pSVar26 != (SynTypeGenericInstance *)0x0) {
                    pTVar12 = AnalyzeType(ctx,pSVar26->baseType,true,failed);
                    bVar6 = isType<TypeError>(pTVar12);
                    if (bVar6) {
                      pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                      return pTVar12;
                    }
                    aliases.tail = (SynIdentifier *)getType<TypeGenericClassProto>(pTVar12);
                    if ((TypeGenericClassProto *)aliases.tail != (TypeGenericClassProto *)0x0) {
                      _auStack_250 = (((TypeGenericClassProto *)aliases.tail)->definition->aliases).
                                     head;
                      aliases.head = (((TypeGenericClassProto *)aliases.tail)->definition->aliases).
                                     tail;
                      uVar7 = IntrusiveList<SynBase>::size(&pSVar26->types);
                      uVar8 = IntrusiveList<SynIdentifier>::size
                                        ((IntrusiveList<SynIdentifier> *)auStack_250);
                      if (uVar7 < uVar8) {
                        uVar7 = IntrusiveList<SynBase>::size(&pSVar26->types);
                        uVar8 = IntrusiveList<SynIdentifier>::size
                                          ((IntrusiveList<SynIdentifier> *)auStack_250);
                        anon_unknown.dwarf_e7629::Stop
                                  (ctx,syntax,
                                   "ERROR: there where only \'%d\' argument(s) to a generic type that expects \'%d\'"
                                   ,(ulong)uVar7,(ulong)uVar8);
                      }
                      uVar7 = IntrusiveList<SynBase>::size(&pSVar26->types);
                      uVar8 = IntrusiveList<SynIdentifier>::size
                                        ((IntrusiveList<SynIdentifier> *)auStack_250);
                      if (uVar8 < uVar7) {
                        uVar7 = IntrusiveList<SynIdentifier>::size
                                          ((IntrusiveList<SynIdentifier> *)auStack_250);
                        uVar8 = IntrusiveList<SynBase>::size(&pSVar26->types);
                        anon_unknown.dwarf_e7629::Stop
                                  (ctx,syntax,
                                   "ERROR: type has only \'%d\' generic argument(s) while \'%d\' specified"
                                   ,(ulong)uVar7,(ulong)uVar8);
                      }
                      types.tail._7_1_ = 0;
                      IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&el_1);
                      type_5 = (TypeBase *)(pSVar26->types).head;
                      while( true ) {
                        if (type_5 == (TypeBase *)0x0) {
                          if ((types.tail._7_1_ & 1) != 0) {
                            generics.tail = types.head;
                            generics.head = (TypeHandle *)el_1;
                            pTVar27 = ExpressionContext::GetGenericClassType
                                                (ctx,syntax,(TypeGenericClassProto *)aliases.tail,
                                                 generics);
                            return &pTVar27->super_TypeBase;
                          }
                          pTVar12 = CreateGenericTypeInstance
                                              (ctx,syntax,(TypeGenericClassProto *)aliases.tail,
                                               (IntrusiveList<TypeHandle> *)&el_1);
                          return pTVar12;
                        }
                        pTVar12 = AnalyzeType(ctx,(SynBase *)type_5,true,failed);
                        if (pTVar12 == ctx->typeAuto) {
                          anon_unknown.dwarf_e7629::Stop
                                    (ctx,syntax,
                                     "ERROR: \'auto\' type cannot be used as template argument");
                        }
                        bVar6 = isType<TypeError>(pTVar12);
                        if (bVar6) break;
                        types.tail._7_1_ =
                             (types.tail._7_1_ & 1) != 0 || (pTVar12->isGeneric & 1U) != 0;
                        pTVar18 = ExpressionContext::get<TypeHandle>(ctx);
                        TypeHandle::TypeHandle(pTVar18,pTVar12);
                        IntrusiveList<TypeHandle>::push_back
                                  ((IntrusiveList<TypeHandle> *)&el_1,pTVar18);
                        type_5 = (TypeBase *)type_5->size;
                      }
                      pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                      return pTVar12;
                    }
                    anon_unknown.dwarf_e7629::Stop
                              (ctx,syntax,"ERROR: type \'%.*s\' can\'t have generic arguments",
                               (ulong)(uint)((int)(pTVar12->name).end - (int)(pTVar12->name).begin),
                               (pTVar12->name).begin);
                  }
                  bVar6 = isType<SynError>(syntax);
                  if (bVar6) {
                    ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
                  }
                  else if (onlyType) {
                    anon_unknown.dwarf_e7629::Stop(ctx,syntax,"ERROR: unknown type");
                    ctx_local = (ExpressionContext *)0x0;
                  }
                  else {
                    ctx_local = (ExpressionContext *)0x0;
                  }
                }
                else {
                  pTVar12 = AnalyzeType(ctx,pSVar24->value,onlyType,failed);
                  if ((onlyType) || (pTVar12 != (TypeBase *)0x0)) {
                    bVar6 = isType<TypeGeneric>(pTVar12);
                    if (bVar6) {
                      ctx_local = (ExpressionContext *)ctx->typeGeneric;
                    }
                    else {
                      bVar6 = isType<TypeError>(pTVar12);
                      if (bVar6) {
                        ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
                      }
                      else {
                        pEVar15 = CreateTypeidMemberAccess(ctx,syntax,pTVar12,pSVar24->member);
                        pEVar25 = getType<ExprTypeLiteral>(pEVar15);
                        if (pEVar25 == (ExprTypeLiteral *)0x0) {
                          if (onlyType) {
                            anon_unknown.dwarf_e7629::Stop
                                      (ctx,syntax,"ERROR: typeof expression result is not a type");
                            ctx_local = (ExpressionContext *)0x0;
                          }
                          else {
                            ctx_local = (ExpressionContext *)0x0;
                          }
                        }
                        else {
                          ctx_local = (ExpressionContext *)pEVar25->value;
                        }
                      }
                    }
                  }
                  else {
                    ctx_local = (ExpressionContext *)0x0;
                  }
                }
              }
              else {
                for (pSStack_1f0 = anon_unknown.dwarf_e7629::NamedOrGlobalScopeFrom(ctx->scope);
                    pSStack_1f0 != (ScopeData *)0x0;
                    pSStack_1f0 = anon_unknown.dwarf_e7629::NamedOrGlobalScopeFrom
                                            (pSStack_1f0->scope)) {
                  if (pSStack_1f0->ownerNamespace == (NamespaceData *)0x0) {
                    local_2cc = NULLC::GetStringHash("");
                  }
                  else {
                    local_2cc = NULLC::StringHashContinue
                                          (pSStack_1f0->ownerNamespace->fullNameHash,".");
                  }
                  part._4_4_ = local_2cc;
                  for (type_4 = (TypeBase *)(pSVar23->path).head; type_4 != (TypeBase *)0x0;
                      type_4 = (TypeBase *)getType<SynIdentifier>((SynBase *)type_4->size)) {
                    uVar7 = NULLC::StringHashContinue
                                      (part._4_4_,(char *)type_4->refType,
                                       (char *)(type_4->arrayTypes).head);
                    part._4_4_ = NULLC::StringHashContinue(uVar7,".");
                  }
                  uVar7 = NULLC::StringHashContinue
                                    (part._4_4_,(pSVar23->name).begin,(pSVar23->name).end);
                  pTVar12 = anon_unknown.dwarf_e7629::LookupTypeByName(ctx,uVar7);
                  if (pTVar12 != (TypeBase *)0x0) {
                    return pTVar12;
                  }
                }
                if (onlyType) {
                  anon_unknown.dwarf_e7629::Report
                            (ctx,syntax,"ERROR: \'%.*s\' is not a known type name",
                             (ulong)(uint)((int)(pSVar23->name).end - (int)(pSVar23->name).begin),
                             (pSVar23->name).begin);
                  ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
                }
                else {
                  ctx_local = (ExpressionContext *)0x0;
                }
              }
            }
            else {
              arguments.tail = (TypeHandle *)AnalyzeType(ctx,pSVar21->returnType,onlyType,failed);
              if ((onlyType) || ((TypeBase *)arguments.tail != (TypeBase *)0x0)) {
                bVar6 = isType<TypeError>((TypeBase *)arguments.tail);
                if (bVar6) {
                  ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
                }
                else {
                  bVar6 = AssertResolvableType(ctx,syntax,(TypeBase *)arguments.tail,true);
                  if (bVar6) {
                    if ((TypeBase *)arguments.tail == ctx->typeAuto) {
                      anon_unknown.dwarf_e7629::Stop
                                (ctx,syntax,"ERROR: return type of a function type cannot be auto");
                    }
                    IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&el);
                    for (argType = (TypeBase *)(pSVar21->arguments).head; argType != (TypeBase *)0x0
                        ; argType = (TypeBase *)argType->size) {
                      pTVar12 = AnalyzeType(ctx,(SynBase *)argType,onlyType,failed);
                      if ((!onlyType) && (pTVar12 == (TypeBase *)0x0)) {
                        return (TypeBase *)0x0;
                      }
                      bVar6 = isType<TypeError>(pTVar12);
                      if (bVar6) {
                        pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                        return pTVar12;
                      }
                      bVar6 = AssertResolvableType(ctx,syntax,pTVar12,true);
                      if (!bVar6) {
                        pTVar12 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
                        return pTVar12;
                      }
                      if (pTVar12 == ctx->typeAuto) {
                        anon_unknown.dwarf_e7629::Stop
                                  (ctx,syntax,"ERROR: function argument cannot be an auto type");
                      }
                      if (pTVar12 == ctx->typeVoid) {
                        anon_unknown.dwarf_e7629::Stop
                                  (ctx,syntax,"ERROR: function argument cannot be a void type");
                      }
                      pTVar18 = ExpressionContext::get<TypeHandle>(ctx);
                      TypeHandle::TypeHandle(pTVar18,pTVar12);
                      IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&el,pTVar18)
                      ;
                    }
                    arguments_00.tail = arguments.head;
                    arguments_00.head = (TypeHandle *)el;
                    ctx_local = (ExpressionContext *)
                                ExpressionContext::GetFunctionType
                                          (ctx,syntax,(TypeBase *)arguments.tail,arguments_00);
                  }
                  else {
                    ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
                  }
                }
              }
              else {
                ctx_local = (ExpressionContext *)0x0;
              }
            }
          }
          else {
            pTVar12 = AnalyzeType(ctx,pSVar13->type,onlyType,failed);
            if ((onlyType) || (pTVar12 != (TypeBase *)0x0)) {
              bVar6 = isType<TypeError>(pTVar12);
              if (bVar6) {
                ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
              }
              else {
                ctx_local = (ExpressionContext *)
                            ApplyArraySizesToType(ctx,pTVar12,(pSVar13->sizes).head);
              }
            }
            else {
              ctx_local = (ExpressionContext *)0x0;
            }
          }
        }
        else {
          pTVar12 = AnalyzeType(ctx,pSVar11->type,true,failed);
          bVar6 = isType<TypeAuto>(pTVar12);
          if (bVar6) {
            ctx_local = (ExpressionContext *)ctx->typeAutoRef;
          }
          else {
            bVar6 = isType<TypeError>(pTVar12);
            if (bVar6) {
              ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
            }
            else {
              bVar6 = AssertResolvableType(ctx,syntax,pTVar12,true);
              if (bVar6) {
                ctx_local = (ExpressionContext *)ExpressionContext::GetReferenceType(ctx,pTVar12);
              }
              else {
                ctx_local = (ExpressionContext *)ExpressionContext::GetErrorType(ctx);
              }
            }
          }
        }
      }
      else {
        ctx_local = (ExpressionContext *)ExpressionContext::GetGenericAliasType(ctx,pSVar10->name);
      }
    }
  }
  return (TypeBase *)ctx_local;
}

Assistant:

TypeBase* AnalyzeType(ExpressionContext &ctx, SynBase *syntax, bool onlyType = true, bool *failed = NULL)
{
	if(isType<SynTypeAuto>(syntax))
	{
		return ctx.typeAuto;
	}

	if(isType<SynTypeGeneric>(syntax))
	{
		return ctx.typeGeneric;
	}

	if(SynTypeAlias *node = getType<SynTypeAlias>(syntax))
	{
		return ctx.GetGenericAliasType(node->name);
	}

	if(SynTypeReference *node = getType<SynTypeReference>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, true, failed);

		if(isType<TypeAuto>(type))
			return ctx.typeAutoRef;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, type, true))
			return ctx.GetErrorType();

		return ctx.GetReferenceType(type);
	}

	if(SynTypeArray *node = getType<SynTypeArray>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->type, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		return ApplyArraySizesToType(ctx, type, node->sizes.head);
	}

	if(SynArrayIndex *node = getType<SynArrayIndex>(syntax))
	{
		TypeBase *type = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !type)
			return NULL;

		if(isType<TypeVoid>(type))
		{
			Report(ctx, syntax, "ERROR: cannot define an array of 'void'");

			return ctx.GetErrorType();
		}

		if(isType<TypeAuto>(type))
		{
			if(!node->arguments.empty())
				Stop(ctx, syntax, "ERROR: cannot specify array size for auto");

			return ctx.typeAutoArray;
		}

		if(isType<TypeError>(type))
			return ctx.GetErrorType();

		if(node->arguments.empty())
		{
			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetUnsizedArrayType(type);
		}

		if(node->arguments.size() > 1)
			Stop(ctx, syntax, "ERROR: ',' is not expected in array type size");

		SynCallArgument *argument = node->arguments.head;

		if(argument->name)
			Stop(ctx, syntax, "ERROR: named argument not expected in array type size");

		ExprBase *size = AnalyzeExpression(ctx, argument->value);

		if(isType<TypeError>(size->type))
			return ctx.GetErrorType();

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax, CreateCast(ctx, node, size, ctx.typeLong, false))))
		{
			if(TypeArgumentSet *lhs = getType<TypeArgumentSet>(type))
			{
				if(number->value < 0)
					Stop(ctx, syntax, "ERROR: argument index can't be negative");

				if(lhs->types.empty())
					Stop(ctx, syntax, "ERROR: function argument set is empty");

				if(number->value >= lhs->types.size())
					Stop(ctx, syntax, "ERROR: this function type '%.*s' has only %d argument(s)", FMT_ISTR(type->name), lhs->types.size());

				return lhs->types[unsigned(number->value)]->type;
			}

			if(number->value <= 0)
				Stop(ctx, syntax, "ERROR: array size can't be negative or zero");

			if(TypeClass *typeClass = getType<TypeClass>(type))
			{
				if(typeClass->hasFinalizer)
					Stop(ctx, syntax, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
			}

			if(type->size >= 64 * 1024)
				Stop(ctx, syntax, "ERROR: array element size cannot exceed 65535 bytes");

			if(!AssertResolvableType(ctx, syntax, type, true))
				return ctx.GetErrorType();

			return ctx.GetArrayType(type, number->value);
		}

		if(!onlyType)
			return NULL;

		Stop(ctx, syntax, "ERROR: index must be a constant expression");
	}

	if(SynTypeFunction *node = getType<SynTypeFunction>(syntax))
	{
		TypeBase *returnType = AnalyzeType(ctx, node->returnType, onlyType, failed);

		if(!onlyType && !returnType)
			return NULL;

		if(isType<TypeError>(returnType))
			return ctx.GetErrorType();

		if(!AssertResolvableType(ctx, syntax, returnType, true))
			return ctx.GetErrorType();

		if(returnType == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: return type of a function type cannot be auto");

		IntrusiveList<TypeHandle> arguments;

		for(SynBase *el = node->arguments.head; el; el = el->next)
		{
			TypeBase *argType = AnalyzeType(ctx, el, onlyType, failed);

			if(!onlyType && !argType)
				return NULL;

			if(isType<TypeError>(argType))
				return ctx.GetErrorType();

			if(!AssertResolvableType(ctx, syntax, argType, true))
				return ctx.GetErrorType();

			if(argType == ctx.typeAuto)
				Stop(ctx, syntax, "ERROR: function argument cannot be an auto type");

			if(argType == ctx.typeVoid)
				Stop(ctx, syntax, "ERROR: function argument cannot be a void type");

			arguments.push_back(new (ctx.get<TypeHandle>()) TypeHandle(argType));
		}

		return ctx.GetFunctionType(syntax, returnType, arguments);
	}

	if(SynTypeof *node = getType<SynTypeof>(syntax))
	{
		jmp_buf prevErrorHandler;
		memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

		bool prevErrorHandlerNested = ctx.errorHandlerNested;
		ctx.errorHandlerNested = true;

		char *errorBuf = ctx.errorBuf;
		unsigned errorBufSize = ctx.errorBufSize;

		if(failed)
		{
			ctx.errorBuf = 0;
			ctx.errorBufSize = 0;
		}

		// Remember current scope
		ScopeData *scope = ctx.scope;

		unsigned traceDepth = NULLC::TraceGetDepth();

		if(!setjmp(ctx.errorHandler))
		{
			TypeBase *type = AnalyzeType(ctx, node->value, false);

			if(!type)
			{
				ExprBase *value = AnalyzeExpression(ctx, node->value);

				if(value->type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

				AssertValueExpression(ctx, syntax, value);

				type = value->type;
			}

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(type)
			{
				if(!AssertResolvableType(ctx, node->value, type, false))
					return ctx.GetErrorType();

				return type;
			}
		}
		else
		{
			NULLC::TraceLeaveTo(traceDepth);

			// Restore original scope
			if(ctx.scope != scope)
				ctx.SwitchToScopeAtPoint(scope, NULL);

			memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
			ctx.errorHandlerNested = prevErrorHandlerNested;

			ctx.errorBuf = errorBuf;
			ctx.errorBufSize = errorBufSize;

			if(failed)
			{
				*failed = true;
				return ctx.typeGeneric;
			}

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(SynTypeSimple *node = getType<SynTypeSimple>(syntax))
	{
		for(ScopeData *nsScope = NamedOrGlobalScopeFrom(ctx.scope); nsScope; nsScope = NamedOrGlobalScopeFrom(nsScope->scope))
		{
			unsigned hash = nsScope->ownerNamespace ? NULLC::StringHashContinue(nsScope->ownerNamespace->fullNameHash, ".") : NULLC::GetStringHash("");

			for(SynIdentifier *part = node->path.head; part; part = getType<SynIdentifier>(part->next))
			{
				hash = NULLC::StringHashContinue(hash, part->name.begin, part->name.end);
				hash = NULLC::StringHashContinue(hash, ".");
			}

			hash = NULLC::StringHashContinue(hash, node->name.begin, node->name.end);

			TypeBase *type = LookupTypeByName(ctx, hash);

			if(type)
				return type;
		}

		// Might be a variable
		if(!onlyType)
			return NULL;

		Report(ctx, syntax, "ERROR: '%.*s' is not a known type name", FMT_ISTR(node->name));

		return ctx.GetErrorType();
	}

	if(SynMemberAccess *node = getType<SynMemberAccess>(syntax))
	{
		TypeBase *value = AnalyzeType(ctx, node->value, onlyType, failed);

		if(!onlyType && !value)
			return NULL;

		if(isType<TypeGeneric>(value))
			return ctx.typeGeneric;

		if(isType<TypeError>(value))
			return ctx.GetErrorType();

		ExprBase *result = CreateTypeidMemberAccess(ctx, syntax, value, node->member);

		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(result))
			return typeLiteral->value;

		// [n]

		if(!onlyType)
			return NULL;

		// isReference/isArray/isFunction/arraySize/hasMember(x)/class member/class typedef

		Stop(ctx, syntax, "ERROR: typeof expression result is not a type");

		return NULL;
	}

	if(SynTypeGenericInstance *node = getType<SynTypeGenericInstance>(syntax))
	{
		TypeBase *baseType = AnalyzeType(ctx, node->baseType, true, failed);

		if(isType<TypeError>(baseType))
			return ctx.GetErrorType();

		// TODO: overloads with a different number of generic arguments

		if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(baseType))
		{
			IntrusiveList<SynIdentifier> aliases = proto->definition->aliases;

			if(node->types.size() < aliases.size())
				Stop(ctx, syntax, "ERROR: there where only '%d' argument(s) to a generic type that expects '%d'", node->types.size(), aliases.size());

			if(node->types.size() > aliases.size())
				Stop(ctx, syntax, "ERROR: type has only '%d' generic argument(s) while '%d' specified", aliases.size(), node->types.size());

			bool isGeneric = false;
			IntrusiveList<TypeHandle> types;

			for(SynBase *el = node->types.head; el; el = el->next)
			{
				TypeBase *type = AnalyzeType(ctx, el, true, failed);

				if(type == ctx.typeAuto)
					Stop(ctx, syntax, "ERROR: 'auto' type cannot be used as template argument");

				if(isType<TypeError>(type))
					return ctx.GetErrorType();

				isGeneric |= type->isGeneric;

				types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(type));
			}

			if(isGeneric)
				return ctx.GetGenericClassType(syntax, proto, types);
			
			return CreateGenericTypeInstance(ctx, syntax, proto, types);
		}

		Stop(ctx, syntax, "ERROR: type '%.*s' can't have generic arguments", FMT_ISTR(baseType->name));
	}

	if(isType<SynError>(syntax))
		return ctx.GetErrorType();

	if(!onlyType)
		return NULL;

	Stop(ctx, syntax, "ERROR: unknown type");

	return NULL;
}